

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::BNTest_NumBitsWord_Test>::CreateTest
          (TestFactoryImpl<(anonymous_namespace)::BNTest_NumBitsWord_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<(anonymous_namespace)::BNTest_NumBitsWord_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_22460c::BNTest_NumBitsWord_Test::BNTest_NumBitsWord_Test
            ((BNTest_NumBitsWord_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override { return new TestClass; }